

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_FormatSizeMByte_Test::Body
          (iu_UnitStringTest_x_iutest_x_FormatSizeMByte_Test *this)

{
  UInt64 in_RDX;
  UInt64 value;
  AssertionResult iutest_ar;
  _Alloc_hider in_stack_fffffffffffffdc8;
  bool local_218;
  iuCodeMessage local_210;
  string local_1e0;
  string local_1c0;
  Fixed local_1a0;
  
  iutest::detail::FormatSizeByte_abi_cxx11_
            (&local_1c0,(detail *)&iutest::TestInfo::is_skipped,in_RDX);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)&stack0xfffffffffffffdc8,(internal *)"\"1MB\"",
             "::iutest::detail::FormatSizeByte(1024 * 1024)","1MB",(char *)&local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffdc8._M_p);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (local_218 == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x108,in_stack_fffffffffffffdc8._M_p);
    local_210._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_210,&local_1a0);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_1e0,(detail *)0x1fffff,value);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)&stack0xfffffffffffffdc8,(internal *)"\"1.9MB\"",
             "::iutest::detail::FormatSizeByte(2 * 1024 * 1024 - 1)","1.9MB",(char *)&local_1e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffdc8._M_p);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (local_218 == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x109,in_stack_fffffffffffffdc8._M_p);
    local_210._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_210,&local_1a0);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
  return;
}

Assistant:

IUTEST(UnitStringTest, FormatSizeMByte)
{
    IUTEST_EXPECT_STREQ("1MB", ::iutest::detail::FormatSizeByte(1024 * 1024));
    IUTEST_EXPECT_STREQ("1.9MB", ::iutest::detail::FormatSizeByte(2 * 1024 * 1024 - 1));
}